

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manual-optimizer.cpp
# Opt level: O3

void __thiscall
manual_course::manual_course
          (manual_course *this,double theta_,double delta_,double kappa_min_,double kappa_step_,
          double init_policy_random_,int length_)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  _Head_base<0UL,_double_*,_false> _Var11;
  double *pdVar12;
  double *__s;
  double *__s_00;
  double *__s_01;
  manual_course *this_00;
  ulong uVar13;
  undefined8 extraout_RAX;
  ulong uVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  uVar13 = 0xffffffffffffffff;
  if (-1 < length_) {
    uVar13 = (long)length_ * 8;
  }
  _Var11._M_head_impl = (double *)operator_new__(uVar13);
  memset(_Var11._M_head_impl,0,uVar13);
  (this->theta)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = _Var11._M_head_impl;
  pdVar12 = (double *)operator_new__(uVar13);
  memset(pdVar12,0,uVar13);
  (this->delta)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar12;
  __s = (double *)operator_new__(uVar13);
  memset(__s,0,uVar13);
  (this->kappa_min)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = __s;
  __s_00 = (double *)operator_new__(uVar13);
  memset(__s_00,0,uVar13);
  (this->kappa_step)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = __s_00;
  __s_01 = (double *)operator_new__(uVar13);
  memset(__s_01,0,uVar13);
  (this->init_policy_random)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = __s_01;
  uVar13 = 0xffffffffffffffff;
  if (-1 < length_) {
    uVar13 = (long)length_ * 4;
  }
  this_00 = (manual_course *)operator_new__(uVar13);
  memset(this_00,0,uVar13);
  (this->iterators)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)this_00;
  this->length = length_;
  if (length_ < 3) {
    manual_course(this_00);
    operator_delete__(__s_01);
    (this->init_policy_random)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
    _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
    pdVar12 = (this->kappa_step)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
              _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
              super__Head_base<0UL,_double_*,_false>._M_head_impl;
    if (pdVar12 != (double *)0x0) {
      operator_delete__(pdVar12);
    }
    (this->kappa_step)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
    pdVar12 = (this->kappa_min)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
              _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
              super__Head_base<0UL,_double_*,_false>._M_head_impl;
    if (pdVar12 != (double *)0x0) {
      operator_delete__(pdVar12);
    }
    (this->kappa_min)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
    pdVar12 = (this->delta)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
              super__Head_base<0UL,_double_*,_false>._M_head_impl;
    if (pdVar12 != (double *)0x0) {
      operator_delete__(pdVar12);
    }
    (this->delta)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
    _Var11._M_head_impl =
         (this->theta)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl;
    if (_Var11._M_head_impl != (double *)0x0) {
      operator_delete__(_Var11._M_head_impl);
    }
    (this->theta)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
    _Unwind_Resume(extraout_RAX);
  }
  dVar23 = (double)length_;
  *_Var11._M_head_impl = theta_;
  uVar13 = 2;
  *pdVar12 = delta_;
  _Var11._M_head_impl[1] = 1.0 / dVar23;
  dVar2 = _Var11._M_head_impl[1];
  pdVar12[1] = 0.1 / dVar23;
  *__s = kappa_min_;
  auVar26._0_8_ = 0.01 / dVar23;
  auVar26._8_8_ = 0;
  *__s_00 = kappa_step_;
  __s[1] = auVar26._0_8_;
  __s_00[1] = 1e-07 / dVar23;
  *__s_01 = init_policy_random_;
  auVar22._0_8_ = 0.9 / dVar23;
  auVar22._8_8_ = 0;
  __s_01[1] = auVar22._0_8_;
  do {
    dVar2 = 1.0 / dVar23 + dVar2;
    _Var11._M_head_impl[uVar13] = dVar2;
    uVar13 = uVar13 + 1;
  } while ((uint)length_ != uVar13);
  auVar15 = vpbroadcastq_avx512f();
  uVar13 = (ulong)(length_ + 5U & 0xfffffff8);
  uVar14 = 0;
  auVar24._0_8_ = 0.1 / (dVar23 * 5.0);
  auVar24._8_8_ = 0;
  auVar16 = vbroadcastsd_avx512f(auVar24);
  auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  do {
    auVar18 = vpbroadcastq_avx512f();
    auVar18 = vporq_avx512f(auVar18,auVar17);
    uVar10 = vpcmpuq_avx512f(auVar18,auVar15,2);
    pdVar1 = _Var11._M_head_impl + uVar14 + 1;
    auVar18._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * (long)pdVar1[1];
    auVar18._0_8_ = (ulong)((byte)uVar10 & 1) * (long)*pdVar1;
    auVar18._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * (long)pdVar1[2];
    auVar18._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * (long)pdVar1[3];
    auVar18._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * (long)pdVar1[4];
    auVar18._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * (long)pdVar1[5];
    auVar18._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * (long)pdVar1[6];
    auVar18._56_8_ = (uVar10 >> 7) * (long)pdVar1[7];
    auVar18 = vaddpd_avx512f(auVar16,auVar18);
    pdVar1 = pdVar12 + uVar14 + 2;
    bVar3 = (bool)((byte)uVar10 & 1);
    bVar4 = (bool)((byte)(uVar10 >> 1) & 1);
    bVar5 = (bool)((byte)(uVar10 >> 2) & 1);
    bVar6 = (bool)((byte)(uVar10 >> 3) & 1);
    bVar7 = (bool)((byte)(uVar10 >> 4) & 1);
    bVar8 = (bool)((byte)(uVar10 >> 5) & 1);
    bVar9 = (bool)((byte)(uVar10 >> 6) & 1);
    *pdVar1 = (double)((ulong)bVar3 * auVar18._0_8_ | (ulong)!bVar3 * (long)*pdVar1);
    pdVar1[1] = (double)((ulong)bVar4 * auVar18._8_8_ | (ulong)!bVar4 * (long)pdVar1[1]);
    pdVar1[2] = (double)((ulong)bVar5 * auVar18._16_8_ | (ulong)!bVar5 * (long)pdVar1[2]);
    pdVar1[3] = (double)((ulong)bVar6 * auVar18._24_8_ | (ulong)!bVar6 * (long)pdVar1[3]);
    pdVar1[4] = (double)((ulong)bVar7 * auVar18._32_8_ | (ulong)!bVar7 * (long)pdVar1[4]);
    pdVar1[5] = (double)((ulong)bVar8 * auVar18._40_8_ | (ulong)!bVar8 * (long)pdVar1[5]);
    pdVar1[6] = (double)((ulong)bVar9 * auVar18._48_8_ | (ulong)!bVar9 * (long)pdVar1[6]);
    pdVar1[7] = (double)((uVar10 >> 7) * auVar18._56_8_ |
                        (ulong)!SUB81(uVar10 >> 7,0) * (long)pdVar1[7]);
    uVar14 = uVar14 + 8;
  } while (uVar13 != uVar14);
  auVar16 = vbroadcastsd_avx512f(auVar26);
  uVar14 = 0;
  do {
    auVar18 = vpbroadcastq_avx512f();
    auVar18 = vporq_avx512f(auVar18,auVar17);
    uVar10 = vpcmpuq_avx512f(auVar18,auVar15,2);
    pdVar12 = _Var11._M_head_impl + uVar14 + 1;
    auVar19._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * (long)pdVar12[1];
    auVar19._0_8_ = (ulong)((byte)uVar10 & 1) * (long)*pdVar12;
    auVar19._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * (long)pdVar12[2];
    auVar19._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * (long)pdVar12[3];
    auVar19._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * (long)pdVar12[4];
    auVar19._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * (long)pdVar12[5];
    auVar19._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * (long)pdVar12[6];
    auVar19._56_8_ = (uVar10 >> 7) * (long)pdVar12[7];
    auVar18 = vaddpd_avx512f(auVar16,auVar19);
    pdVar12 = __s + uVar14 + 2;
    bVar3 = (bool)((byte)uVar10 & 1);
    bVar4 = (bool)((byte)(uVar10 >> 1) & 1);
    bVar5 = (bool)((byte)(uVar10 >> 2) & 1);
    bVar6 = (bool)((byte)(uVar10 >> 3) & 1);
    bVar7 = (bool)((byte)(uVar10 >> 4) & 1);
    bVar8 = (bool)((byte)(uVar10 >> 5) & 1);
    bVar9 = (bool)((byte)(uVar10 >> 6) & 1);
    *pdVar12 = (double)((ulong)bVar3 * auVar18._0_8_ | (ulong)!bVar3 * (long)*pdVar12);
    pdVar12[1] = (double)((ulong)bVar4 * auVar18._8_8_ | (ulong)!bVar4 * (long)pdVar12[1]);
    pdVar12[2] = (double)((ulong)bVar5 * auVar18._16_8_ | (ulong)!bVar5 * (long)pdVar12[2]);
    pdVar12[3] = (double)((ulong)bVar6 * auVar18._24_8_ | (ulong)!bVar6 * (long)pdVar12[3]);
    pdVar12[4] = (double)((ulong)bVar7 * auVar18._32_8_ | (ulong)!bVar7 * (long)pdVar12[4]);
    pdVar12[5] = (double)((ulong)bVar8 * auVar18._40_8_ | (ulong)!bVar8 * (long)pdVar12[5]);
    pdVar12[6] = (double)((ulong)bVar9 * auVar18._48_8_ | (ulong)!bVar9 * (long)pdVar12[6]);
    pdVar12[7] = (double)((uVar10 >> 7) * auVar18._56_8_ |
                         (ulong)!SUB81(uVar10 >> 7,0) * (long)pdVar12[7]);
    uVar14 = uVar14 + 8;
  } while (uVar13 != uVar14);
  auVar25._0_8_ = 1e-07 / (dVar23 * 5.0);
  auVar25._8_8_ = 0;
  uVar14 = 0;
  auVar16 = vbroadcastsd_avx512f(auVar25);
  do {
    auVar18 = vpbroadcastq_avx512f();
    auVar18 = vporq_avx512f(auVar18,auVar17);
    uVar10 = vpcmpuq_avx512f(auVar18,auVar15,2);
    pdVar12 = _Var11._M_head_impl + uVar14 + 1;
    auVar20._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * (long)pdVar12[1];
    auVar20._0_8_ = (ulong)((byte)uVar10 & 1) * (long)*pdVar12;
    auVar20._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * (long)pdVar12[2];
    auVar20._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * (long)pdVar12[3];
    auVar20._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * (long)pdVar12[4];
    auVar20._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * (long)pdVar12[5];
    auVar20._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * (long)pdVar12[6];
    auVar20._56_8_ = (uVar10 >> 7) * (long)pdVar12[7];
    auVar18 = vaddpd_avx512f(auVar16,auVar20);
    pdVar12 = __s_00 + uVar14 + 2;
    bVar3 = (bool)((byte)uVar10 & 1);
    bVar4 = (bool)((byte)(uVar10 >> 1) & 1);
    bVar5 = (bool)((byte)(uVar10 >> 2) & 1);
    bVar6 = (bool)((byte)(uVar10 >> 3) & 1);
    bVar7 = (bool)((byte)(uVar10 >> 4) & 1);
    bVar8 = (bool)((byte)(uVar10 >> 5) & 1);
    bVar9 = (bool)((byte)(uVar10 >> 6) & 1);
    *pdVar12 = (double)((ulong)bVar3 * auVar18._0_8_ | (ulong)!bVar3 * (long)*pdVar12);
    pdVar12[1] = (double)((ulong)bVar4 * auVar18._8_8_ | (ulong)!bVar4 * (long)pdVar12[1]);
    pdVar12[2] = (double)((ulong)bVar5 * auVar18._16_8_ | (ulong)!bVar5 * (long)pdVar12[2]);
    pdVar12[3] = (double)((ulong)bVar6 * auVar18._24_8_ | (ulong)!bVar6 * (long)pdVar12[3]);
    pdVar12[4] = (double)((ulong)bVar7 * auVar18._32_8_ | (ulong)!bVar7 * (long)pdVar12[4]);
    pdVar12[5] = (double)((ulong)bVar8 * auVar18._40_8_ | (ulong)!bVar8 * (long)pdVar12[5]);
    pdVar12[6] = (double)((ulong)bVar9 * auVar18._48_8_ | (ulong)!bVar9 * (long)pdVar12[6]);
    pdVar12[7] = (double)((uVar10 >> 7) * auVar18._56_8_ |
                         (ulong)!SUB81(uVar10 >> 7,0) * (long)pdVar12[7]);
    uVar14 = uVar14 + 8;
  } while (uVar13 != uVar14);
  auVar16 = vbroadcastsd_avx512f(auVar22);
  uVar13 = 0;
  do {
    auVar18 = vpbroadcastq_avx512f();
    auVar18 = vporq_avx512f(auVar18,auVar17);
    uVar14 = vpcmpuq_avx512f(auVar18,auVar15,2);
    pdVar12 = _Var11._M_head_impl + uVar13 + 1;
    auVar21._8_8_ = (ulong)((byte)(uVar14 >> 1) & 1) * (long)pdVar12[1];
    auVar21._0_8_ = (ulong)((byte)uVar14 & 1) * (long)*pdVar12;
    auVar21._16_8_ = (ulong)((byte)(uVar14 >> 2) & 1) * (long)pdVar12[2];
    auVar21._24_8_ = (ulong)((byte)(uVar14 >> 3) & 1) * (long)pdVar12[3];
    auVar21._32_8_ = (ulong)((byte)(uVar14 >> 4) & 1) * (long)pdVar12[4];
    auVar21._40_8_ = (ulong)((byte)(uVar14 >> 5) & 1) * (long)pdVar12[5];
    auVar21._48_8_ = (ulong)((byte)(uVar14 >> 6) & 1) * (long)pdVar12[6];
    auVar21._56_8_ = (uVar14 >> 7) * (long)pdVar12[7];
    auVar18 = vaddpd_avx512f(auVar16,auVar21);
    pdVar12 = __s_01 + uVar13 + 2;
    bVar3 = (bool)((byte)uVar14 & 1);
    bVar4 = (bool)((byte)(uVar14 >> 1) & 1);
    bVar5 = (bool)((byte)(uVar14 >> 2) & 1);
    bVar6 = (bool)((byte)(uVar14 >> 3) & 1);
    bVar7 = (bool)((byte)(uVar14 >> 4) & 1);
    bVar8 = (bool)((byte)(uVar14 >> 5) & 1);
    bVar9 = (bool)((byte)(uVar14 >> 6) & 1);
    *pdVar12 = (double)((ulong)bVar3 * auVar18._0_8_ | (ulong)!bVar3 * (long)*pdVar12);
    pdVar12[1] = (double)((ulong)bVar4 * auVar18._8_8_ | (ulong)!bVar4 * (long)pdVar12[1]);
    pdVar12[2] = (double)((ulong)bVar5 * auVar18._16_8_ | (ulong)!bVar5 * (long)pdVar12[2]);
    pdVar12[3] = (double)((ulong)bVar6 * auVar18._24_8_ | (ulong)!bVar6 * (long)pdVar12[3]);
    pdVar12[4] = (double)((ulong)bVar7 * auVar18._32_8_ | (ulong)!bVar7 * (long)pdVar12[4]);
    pdVar12[5] = (double)((ulong)bVar8 * auVar18._40_8_ | (ulong)!bVar8 * (long)pdVar12[5]);
    pdVar12[6] = (double)((ulong)bVar9 * auVar18._48_8_ | (ulong)!bVar9 * (long)pdVar12[6]);
    pdVar12[7] = (double)((uVar14 >> 7) * auVar18._56_8_ |
                         (ulong)!SUB81(uVar14 >> 7,0) * (long)pdVar12[7]);
    uVar13 = uVar13 + 8;
  } while ((length_ + 5U & 0xfffffff8) != uVar13);
  memset(this_00,0,(ulong)(uint)length_ << 2);
  return;
}

Assistant:

manual_course(double theta_,
                  double delta_,
                  double kappa_min_,
                  double kappa_step_,
                  double init_policy_random_,
                  int length_)
      : theta(std::make_unique<double[]>(length_))
      , delta(std::make_unique<double[]>(length_))
      , kappa_min(std::make_unique<double[]>(length_))
      , kappa_step(std::make_unique<double[]>(length_))
      , init_policy_random(std::make_unique<double[]>(length_))
      , iterators(std::make_unique<int[]>(length_))
      , length(length_)
    {
        bx_ensures(length > 2);

        theta[0] = theta_;
        theta[1] = 1.0 / static_cast<double>(length);

        delta[0] = delta_;
        delta[1] = 0.1 / static_cast<double>(length);

        kappa_min[0] = kappa_min_;
        kappa_min[1] = 1e-2 / static_cast<double>(length);

        kappa_step[0] = kappa_step_;
        kappa_step[1] = 1e-7 / static_cast<double>(length);

        init_policy_random[0] = init_policy_random_;
        init_policy_random[1] = 0.9 / static_cast<double>(length);

        for (int i = 2; i != length; ++i)
            theta[i] = theta[i - 1] + 1.0 / static_cast<double>(length);

        for (int i = 2; i != length; ++i)
            delta[i] =
              theta[i - 1] + 0.1 / (5.0 * static_cast<double>(length));

        for (int i = 2; i != length; ++i)
            kappa_min[i] = theta[i - 1] + 1e-2 / static_cast<double>(length);

        for (int i = 2; i != length; ++i)
            kappa_step[i] =
              theta[i - 1] + 1e-7 / (5.0 * static_cast<double>(length));

        for (int i = 2; i != length; ++i)
            init_policy_random[i] =
              theta[i - 1] + 0.9 / static_cast<double>(length);

        reset();
    }